

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SeesPdu.cpp
# Opt level: O1

void __thiscall DIS::SeesPdu::SeesPdu(SeesPdu *this)

{
  DistributedEmissionsFamilyPdu::DistributedEmissionsFamilyPdu
            (&this->super_DistributedEmissionsFamilyPdu);
  (this->super_DistributedEmissionsFamilyPdu).super_Pdu.super_PduSuperclass._vptr_PduSuperclass =
       (_func_int **)&PTR__SeesPdu_001b5de8;
  EntityID::EntityID(&this->_orginatingEntityID);
  this->_numberOfVectoringNozzleSystems = 0;
  this->_infraredSignatureRepresentationIndex = 0;
  this->_acousticSignatureRepresentationIndex = 0;
  this->_radarCrossSectionSignatureRepresentationIndex = 0;
  this->_numberOfPropulsionSystems = 0;
  (this->_propulsionSystemData).
  super__Vector_base<DIS::PropulsionSystemData,_std::allocator<DIS::PropulsionSystemData>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_propulsionSystemData).
  super__Vector_base<DIS::PropulsionSystemData,_std::allocator<DIS::PropulsionSystemData>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_propulsionSystemData).
  super__Vector_base<DIS::PropulsionSystemData,_std::allocator<DIS::PropulsionSystemData>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_vectoringSystemData).
  super__Vector_base<DIS::VectoringNozzleSystem,_std::allocator<DIS::VectoringNozzleSystem>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_vectoringSystemData).
  super__Vector_base<DIS::VectoringNozzleSystem,_std::allocator<DIS::VectoringNozzleSystem>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_vectoringSystemData).
  super__Vector_base<DIS::VectoringNozzleSystem,_std::allocator<DIS::VectoringNozzleSystem>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  PduSuperclass::setPduType((PduSuperclass *)this,'\x1e');
  return;
}

Assistant:

SeesPdu::SeesPdu() : DistributedEmissionsFamilyPdu(),
   _orginatingEntityID(), 
   _infraredSignatureRepresentationIndex(0), 
   _acousticSignatureRepresentationIndex(0), 
   _radarCrossSectionSignatureRepresentationIndex(0), 
   _numberOfPropulsionSystems(0), 
   _numberOfVectoringNozzleSystems(0)
{
    setPduType( 30 );
}